

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

void __thiscall
cmCTestBZR::UpdateParser::UpdateParser(UpdateParser *this,cmCTestBZR *bzr,char *prefix)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__UpdateParser_00a0b590;
  this->BZR = bzr;
  (this->RegexUpdate).regmust = (char *)0x0;
  (this->RegexUpdate).program = (char *)0x0;
  (this->RegexUpdate).progsize = 0;
  memset(&this->RegexUpdate,0,0x20a);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(bzr->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexUpdate,"^([-+R?XCP ])([NDKM ])([* ]) +(.+)$");
  return;
}

Assistant:

UpdateParser(cmCTestBZR* bzr, const char* prefix)
    : BZR(bzr)
  {
    this->SetLog(&bzr->Log, prefix);
    this->RegexUpdate.compile("^([-+R?XCP ])([NDKM ])([* ]) +(.+)$");
  }